

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_7_channels_with_8_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  __m128 cs;
  __m128 c;
  __m128 tot3;
  __m128 tot2;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_5c0;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_43c;
  float fStack_430;
  float fStack_424;
  float local_418;
  float fStack_3fc;
  float fStack_3f0;
  float fStack_3e4;
  float local_3d8;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  
  decode = output_buffer;
  pfStack_5c0 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar1 = decode_buffer + (int)*horizontal_coefficients_local * 7;
    local_3d8 = (float)*(undefined8 *)pfStack_5c0;
    local_1e8 = (float)*(undefined8 *)pfVar1;
    fStack_1e4 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    fStack_1e0 = (float)*(undefined8 *)(pfVar1 + 2);
    fStack_1dc = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    local_208 = (float)*(undefined8 *)(pfVar1 + 3);
    fStack_204 = (float)((ulong)*(undefined8 *)(pfVar1 + 3) >> 0x20);
    fStack_200 = (float)*(undefined8 *)(pfVar1 + 5);
    fStack_1fc = (float)((ulong)*(undefined8 *)(pfVar1 + 5) >> 0x20);
    fStack_3e4 = (float)((ulong)*(undefined8 *)pfStack_5c0 >> 0x20);
    local_228 = (float)*(undefined8 *)(pfVar1 + 7);
    fStack_224 = (float)((ulong)*(undefined8 *)(pfVar1 + 7) >> 0x20);
    fStack_220 = (float)*(undefined8 *)(pfVar1 + 9);
    fStack_21c = (float)((ulong)*(undefined8 *)(pfVar1 + 9) >> 0x20);
    local_248 = (float)*(undefined8 *)(pfVar1 + 10);
    fStack_244 = (float)((ulong)*(undefined8 *)(pfVar1 + 10) >> 0x20);
    fStack_240 = (float)*(undefined8 *)(pfVar1 + 0xc);
    fStack_23c = (float)((ulong)*(undefined8 *)(pfVar1 + 0xc) >> 0x20);
    fStack_3f0 = (float)*(undefined8 *)(pfStack_5c0 + 2);
    local_268 = (float)*(undefined8 *)(pfVar1 + 0xe);
    fStack_264 = (float)((ulong)*(undefined8 *)(pfVar1 + 0xe) >> 0x20);
    fStack_260 = (float)*(undefined8 *)(pfVar1 + 0x10);
    fStack_25c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x10) >> 0x20);
    local_288 = (float)*(undefined8 *)(pfVar1 + 0x11);
    fStack_284 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x11) >> 0x20);
    fStack_280 = (float)*(undefined8 *)(pfVar1 + 0x13);
    fStack_27c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x13) >> 0x20);
    fStack_3fc = (float)((ulong)*(undefined8 *)(pfStack_5c0 + 2) >> 0x20);
    local_2a8 = (float)*(undefined8 *)(pfVar1 + 0x15);
    fStack_2a4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x15) >> 0x20);
    fStack_2a0 = (float)*(undefined8 *)(pfVar1 + 0x17);
    fStack_29c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x17) >> 0x20);
    local_2c8 = (float)*(undefined8 *)(pfVar1 + 0x18);
    fStack_2c4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x18) >> 0x20);
    fStack_2c0 = (float)*(undefined8 *)(pfVar1 + 0x1a);
    fStack_2bc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1a) >> 0x20);
    local_418 = (float)*(undefined8 *)(pfStack_5c0 + 4);
    local_2e8 = (float)*(undefined8 *)(pfVar1 + 0x1c);
    fStack_2e4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1c) >> 0x20);
    fStack_2e0 = (float)*(undefined8 *)(pfVar1 + 0x1e);
    fStack_2dc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1e) >> 0x20);
    local_308 = (float)*(undefined8 *)(pfVar1 + 0x1f);
    fStack_304 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1f) >> 0x20);
    fStack_300 = (float)*(undefined8 *)(pfVar1 + 0x21);
    fStack_2fc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x21) >> 0x20);
    fStack_424 = (float)((ulong)*(undefined8 *)(pfStack_5c0 + 4) >> 0x20);
    local_328 = (float)*(undefined8 *)(pfVar1 + 0x23);
    fStack_324 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x23) >> 0x20);
    fStack_320 = (float)*(undefined8 *)(pfVar1 + 0x25);
    fStack_31c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x25) >> 0x20);
    local_348 = (float)*(undefined8 *)(pfVar1 + 0x26);
    fStack_344 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x26) >> 0x20);
    fStack_340 = (float)*(undefined8 *)(pfVar1 + 0x28);
    fStack_33c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x28) >> 0x20);
    fStack_430 = (float)*(undefined8 *)(pfStack_5c0 + 6);
    local_368 = (float)*(undefined8 *)(pfVar1 + 0x2a);
    fStack_364 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x2a) >> 0x20);
    fStack_360 = (float)*(undefined8 *)(pfVar1 + 0x2c);
    fStack_35c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x2c) >> 0x20);
    local_388 = (float)*(undefined8 *)(pfVar1 + 0x2d);
    fStack_384 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x2d) >> 0x20);
    fStack_380 = (float)*(undefined8 *)(pfVar1 + 0x2f);
    fStack_37c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x2f) >> 0x20);
    fStack_43c = (float)((ulong)*(undefined8 *)(pfStack_5c0 + 6) >> 0x20);
    local_3a8 = (float)*(undefined8 *)(pfVar1 + 0x31);
    fStack_3a4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x31) >> 0x20);
    fStack_3a0 = (float)*(undefined8 *)(pfVar1 + 0x33);
    fStack_39c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x33) >> 0x20);
    local_3c8 = (float)*(undefined8 *)(pfVar1 + 0x34);
    fStack_3c4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x34) >> 0x20);
    fStack_3c0 = (float)*(undefined8 *)(pfVar1 + 0x36);
    fStack_3bc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x36) >> 0x20);
    *(ulong *)(decode + 3) =
         CONCAT44(local_3d8 * fStack_204 + fStack_3f0 * fStack_284 + local_418 * fStack_304 +
                  fStack_430 * fStack_384 +
                  fStack_3e4 * fStack_244 + fStack_3fc * fStack_2c4 + fStack_424 * fStack_344 +
                  fStack_43c * fStack_3c4,
                  local_3d8 * local_208 + fStack_3f0 * local_288 + local_418 * local_308 +
                  fStack_430 * local_388 +
                  fStack_3e4 * local_248 + fStack_3fc * local_2c8 + fStack_424 * local_348 +
                  fStack_43c * local_3c8);
    *(ulong *)(decode + 5) =
         CONCAT44(local_3d8 * fStack_1fc + fStack_3f0 * fStack_27c + local_418 * fStack_2fc +
                  fStack_430 * fStack_37c +
                  fStack_3e4 * fStack_23c + fStack_3fc * fStack_2bc + fStack_424 * fStack_33c +
                  fStack_43c * fStack_3bc,
                  local_3d8 * fStack_200 + fStack_3f0 * fStack_280 + local_418 * fStack_300 +
                  fStack_430 * fStack_380 +
                  fStack_3e4 * fStack_240 + fStack_3fc * fStack_2c0 + fStack_424 * fStack_340 +
                  fStack_43c * fStack_3c0);
    *(ulong *)decode =
         CONCAT44(local_3d8 * fStack_1e4 + fStack_3f0 * fStack_264 + local_418 * fStack_2e4 +
                  fStack_430 * fStack_364 +
                  fStack_3e4 * fStack_224 + fStack_3fc * fStack_2a4 + fStack_424 * fStack_324 +
                  fStack_43c * fStack_3a4,
                  local_3d8 * local_1e8 + fStack_3f0 * local_268 + local_418 * local_2e8 +
                  fStack_430 * local_368 +
                  fStack_3e4 * local_228 + fStack_3fc * local_2a8 + fStack_424 * local_328 +
                  fStack_43c * local_3a8);
    *(ulong *)(decode + 2) =
         CONCAT44(local_3d8 * fStack_1dc + fStack_3f0 * fStack_25c + local_418 * fStack_2dc +
                  fStack_430 * fStack_35c +
                  fStack_3e4 * fStack_21c + fStack_3fc * fStack_29c + fStack_424 * fStack_31c +
                  fStack_43c * fStack_39c,
                  local_3d8 * fStack_1e0 + fStack_3f0 * fStack_260 + local_418 * fStack_2e0 +
                  fStack_430 * fStack_360 +
                  fStack_3e4 * fStack_220 + fStack_3fc * fStack_2a0 + fStack_424 * fStack_320 +
                  fStack_43c * fStack_3a0);
    pfStack_5c0 = pfStack_5c0 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 7;
  } while (decode < output_buffer + output_sub_size * 7);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_8_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__store_output();
  } while ( output < output_end );
}